

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O1

bool is_valid(CameraPose *pose,
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *x,vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *X)

{
  long lVar1;
  double dVar2;
  double dVar3;
  pointer pMVar4;
  pointer pMVar5;
  ulong uVar6;
  ActualDstType actualDst;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  
  pMVar4 = (x->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(x->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
  bVar10 = lVar7 == 0;
  if (!bVar10) {
    lVar7 = lVar7 >> 3;
    uVar6 = lVar7 * -0x5555555555555555;
    pMVar5 = (X->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0x10;
    uVar9 = 1;
    do {
      dVar19 = *(double *)
                ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar8 + -0x10);
      dVar2 = *(double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar8 + -8);
      dVar3 = *(double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar8);
      auVar16 = *(undefined1 (*) [16])
                 ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar8 + -0x10);
      dVar17 = *(double *)
                ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar8);
      dVar18 = dVar17 * dVar17 + auVar16._8_8_ * auVar16._8_8_ + auVar16._0_8_ * auVar16._0_8_;
      if (0.0 < dVar18) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar18;
        auVar13 = sqrtpd(auVar13,auVar13);
        auVar14._0_8_ = auVar13._0_8_;
        dVar17 = dVar17 / auVar14._0_8_;
        auVar14._8_8_ = auVar14._0_8_;
        auVar16 = divpd(auVar16,auVar14);
      }
      dVar18 = *(double *)
                ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar8) *
               (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] +
               *(double *)
                ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar8 + -8) *
               (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] +
               *(double *)
                ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar8 + -0x10) *
               (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] +
               (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      auVar15._0_8_ =
           dVar3 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6] +
           dVar2 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3] +
           dVar19 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0] +
           (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar15._8_8_ =
           dVar3 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] +
           dVar2 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] +
           dVar19 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1] +
           (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      dVar19 = dVar18 * dVar18 + auVar15._8_8_ * auVar15._8_8_ + auVar15._0_8_ * auVar15._0_8_;
      if (0.0 < dVar19) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar19;
        auVar13 = sqrtpd(auVar11,auVar11);
        auVar12._0_8_ = auVar13._0_8_;
        dVar18 = dVar18 / auVar12._0_8_;
        auVar12._8_8_ = auVar12._0_8_;
        auVar15 = divpd(auVar15,auVar12);
      }
      if (1e-08 < ABS(1.0 - (auVar16._8_8_ * auVar15._8_8_ + auVar16._0_8_ * auVar15._0_8_ +
                            dVar17 * dVar18))) {
        return bVar10;
      }
      bVar10 = uVar6 < uVar9 || uVar6 - uVar9 == 0;
      lVar8 = lVar8 + 0x18;
      lVar1 = (lVar7 * 0x5555555555555555 - (ulong)(uVar6 == 0)) + uVar9;
      uVar9 = uVar9 + 1;
    } while (lVar1 != 0);
  }
  return bVar10;
}

Assistant:

bool is_valid(const CameraPose &pose, const std::vector<Eigen::Vector3d> &x, const std::vector<Eigen::Vector3d> &X) {
    for(int k = 0; k < x.size(); ++k) {
        Eigen::Vector3d z = pose.R * X[k] + pose.t;
        double res = std::abs(1 - x[k].normalized().dot(z.normalized()));
        if(res > 1e-8) {        
            return false;
        }
    }
    return true;
}